

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
DescriptorKeyInfo_GetExtPubkeyInformation_Test::TestBody
          (DescriptorKeyInfo_GetExtPubkeyInformation_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_160;
  AssertionResult gtest_ar;
  string local_138;
  string key_str;
  string ext_path_str;
  string ext_str;
  string path;
  string extkey;
  ExtPubkey pubkey;
  
  std::__cxx11::string::string
            ((string *)&extkey,
             "tpubDDNapBCUaChXpE91grWNGp8xWg84GcS1iRSR7iynAFTv6JAGnKTEUB3vkHtsV4NbkZf6SfjYM6PvW3kZ77KLUZ2GTYNBN4PJRWCKN1ERjJe"
             ,(allocator *)&pubkey);
  cfd::core::ExtPubkey::ExtPubkey(&pubkey,&extkey);
  std::__cxx11::string::string((string *)&path,"0/1",(allocator *)&ext_str);
  std::__cxx11::string::string((string *)&ext_str,"[b7665978]",(allocator *)&ext_path_str);
  std::operator+(&key_str,"[b7665978/",&path);
  std::operator+(&ext_path_str,&key_str,"]");
  std::__cxx11::string::~string((string *)&key_str);
  key_str._M_dataplus._M_p = (pointer)&key_str.field_2;
  key_str._M_string_length = 0;
  key_str.field_2._M_local_buf[0] = '\0';
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_138,"",(allocator *)&local_160);
      cfd::core::DescriptorKeyInfo::GetExtPubkeyInformation((string *)&gtest_ar,&pubkey,&local_138);
      std::__cxx11::string::operator=((string *)&key_str,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&local_138);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5fe,
               "Expected: key_str = DescriptorKeyInfo::GetExtPubkeyInformation(pubkey, \"\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"key_str.c_str()","ext_str.c_str()",key_str._M_dataplus._M_p,
             ext_str._M_dataplus._M_p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5ff,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::GetExtPubkeyInformation((string *)&gtest_ar,&pubkey,&path);
      std::__cxx11::string::operator=((string *)&key_str,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x601,
               "Expected: key_str = DescriptorKeyInfo::GetExtPubkeyInformation(pubkey, path) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"key_str.c_str()","ext_path_str.c_str()",key_str._M_dataplus._M_p
             ,ext_path_str._M_dataplus._M_p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x602,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&key_str);
  std::__cxx11::string::~string((string *)&ext_path_str);
  std::__cxx11::string::~string((string *)&ext_str);
  std::__cxx11::string::~string((string *)&path);
  cfd::core::ExtPubkey::~ExtPubkey(&pubkey);
  std::__cxx11::string::~string((string *)&extkey);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, GetExtPubkeyInformation) {
  std::string extkey = "tpubDDNapBCUaChXpE91grWNGp8xWg84GcS1iRSR7iynAFTv6JAGnKTEUB3vkHtsV4NbkZf6SfjYM6PvW3kZ77KLUZ2GTYNBN4PJRWCKN1ERjJe";
  ExtPubkey pubkey(extkey);
  std::string path = "0/1";
  std::string ext_str = "[b7665978]";
  std::string ext_path_str = "[b7665978/" + path + "]";
  std::string key_str;

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPubkeyInformation(pubkey, ""));
  EXPECT_STREQ(key_str.c_str(), ext_str.c_str());

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPubkeyInformation(pubkey, path));
  EXPECT_STREQ(key_str.c_str(), ext_path_str.c_str());
}